

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# assertions.h
# Opt level: O2

_List_iterator<long>
UnitTests::OutputElement<std::_List_iterator<long>>
          (ostream *os,_List_iterator<long> iter,_List_iterator<long> end)

{
  expected_got_outputter<long> local_10;
  
  if (iter._M_node == end._M_node) {
    std::operator<<(os,"##EOF!##");
  }
  else {
    local_10.t = (long *)(iter._M_node + 1);
    details::operator<<(os,&local_10);
    iter._M_node = (iter._M_node)->_M_next;
  }
  return (_List_iterator<long>)iter._M_node;
}

Assistant:

It OutputElement(std::ostream& os, It iter, It end)
    {
        if (iter != end)
        {
            os << stream(*iter);
            return ++iter;
        }
        os << "##EOF!##";
        return iter;
    }